

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeom_utility.h
# Opt level: O0

void GetSideShapeFunction<pztopology::TPZTetrahedron>
               (int side,TPZVec<double> *qsiSide,TPZFMatrix<double> *phi,TPZFMatrix<double> *dphi)

{
  MElementType MVar1;
  ostream *poVar2;
  int in_EDI;
  stringstream sout;
  size_t in_stack_000001a8;
  char *in_stack_000001b0;
  MElementType sideType;
  TPZFMatrix<double> *in_stack_fffffffffffffd88;
  TPZVec<double> *in_stack_fffffffffffffd90;
  TPZFMatrix<double> *in_stack_fffffffffffffda0;
  TPZFMatrix<double> *in_stack_fffffffffffffda8;
  TPZVec<double> *in_stack_fffffffffffffdb0;
  undefined4 in_stack_fffffffffffffdc0;
  undefined4 in_stack_fffffffffffffdc4;
  TPZFMatrix<double> *in_stack_fffffffffffffdc8;
  TPZVec<double> *in_stack_fffffffffffffdd0;
  string local_220 [16];
  TPZFMatrix<double> *in_stack_fffffffffffffdf0;
  TPZFMatrix<double> *in_stack_fffffffffffffdf8;
  TPZVec<double> *in_stack_fffffffffffffe00;
  string local_1e0 [32];
  TPZFMatrix<double> *in_stack_fffffffffffffe40;
  TPZFMatrix<double> *in_stack_fffffffffffffe48;
  TPZVec<double> *in_stack_fffffffffffffe50;
  ostream local_1a0 [12];
  MElementType in_stack_fffffffffffffe6c;
  TPZFMatrix<double> *in_stack_fffffffffffffe70;
  TPZFMatrix<double> *in_stack_fffffffffffffe78;
  TPZVec<double> *in_stack_fffffffffffffe80;
  TPZFMatrix<double> *in_stack_ffffffffffffff00;
  TPZFMatrix<double> *in_stack_ffffffffffffff08;
  TPZVec<double> *in_stack_ffffffffffffff10;
  
  MVar1 = pztopology::TPZTetrahedron::Type(in_EDI);
  switch(MVar1) {
  case EPoint:
    pztopology::TPZPoint::TShape<double>
              (in_stack_fffffffffffffd90,in_stack_fffffffffffffd88,(TPZFMatrix<double> *)0x1630a21);
    break;
  case EOned:
    pztopology::TPZLine::TShape<double>
              (in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8,in_stack_fffffffffffffda0);
    break;
  case ETriangle:
    pztopology::TPZTriangle::TShape<double>
              (in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8,
               (TPZFMatrix<double> *)CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0));
    break;
  case EQuadrilateral:
    pztopology::TPZQuadrilateral::TShape<double>
              (in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf0);
    break;
  case ETetraedro:
    pztopology::TPZTetrahedron::TShape<double>
              (in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8,
               (TPZFMatrix<double> *)CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0));
    break;
  case EPiramide:
    pztopology::TPZPyramid::TShape<double>
              (in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,in_stack_fffffffffffffe70);
    break;
  case EPrisma:
    pztopology::TPZPrism::TShape<double>
              (in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,in_stack_fffffffffffffe40);
    break;
  case ECube:
    pztopology::TPZCube::TShape<double>
              (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,in_stack_ffffffffffffff00);
    break;
  default:
    std::__cxx11::stringstream::stringstream((stringstream *)&stack0xfffffffffffffe50);
    poVar2 = std::operator<<(local_1a0,
                             "Could not find associated shape function to the side. Details are as follows:"
                            );
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    poVar2 = std::operator<<(local_1a0,"Element is of type ");
    pztopology::TPZTetrahedron::Type();
    MElementType_Name_abi_cxx11_(in_stack_fffffffffffffe6c);
    poVar2 = std::operator<<(poVar2,local_1e0);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string(local_1e0);
    poVar2 = std::operator<<(local_1a0,"Side\t");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,in_EDI);
    poVar2 = std::operator<<(poVar2," is of type\t");
    MElementType_Name_abi_cxx11_(in_stack_fffffffffffffe6c);
    poVar2 = std::operator<<(poVar2,(string *)&stack0xfffffffffffffe00);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffe00);
    poVar2 = (ostream *)std::ostream::operator<<(&std::cerr,std::endl<char,std::char_traits<char>>);
    std::__cxx11::stringstream::str();
    poVar2 = std::operator<<(poVar2,local_220);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string(local_220);
    pzinternal::DebugStopImpl(in_stack_000001b0,in_stack_000001a8);
    std::__cxx11::stringstream::~stringstream((stringstream *)&stack0xfffffffffffffe50);
  }
  return;
}

Assistant:

inline void GetSideShapeFunction(int side, TPZVec<REAL> &qsiSide, TPZFMatrix<REAL> &phi,TPZFMatrix<REAL> &dphi ){
    MElementType  sideType = Topology::Type(side);
#ifdef PZDEBUG
    std::stringstream sout;
    REAL tol = pztopology::GetTolerance();
    if(!IsInSideParametricDomain<Topology>(side,qsiSide,tol)){
        sout<<"The method expects the coordinates in the side's parametric domain. Exiting..."<<std::endl;
        DebugStop();
    }
#endif
    switch (sideType){
        case EPoint:
            return pzgeom::TPZGeoPoint::TShape(qsiSide,phi,dphi);
        case EOned:
            return pzgeom::TPZGeoLinear::TShape(qsiSide,phi,dphi);
        case ETriangle:
            return pzgeom::TPZGeoTriangle::TShape(qsiSide,phi,dphi);
        case EQuadrilateral:
            return pzgeom::TPZGeoQuad::TShape(qsiSide,phi,dphi);
        case ETetraedro:
            return pzgeom::TPZGeoTetrahedra::TShape(qsiSide,phi,dphi);
        case EPiramide:
            return pzgeom::TPZGeoPyramid::TShape(qsiSide,phi,dphi);
        case EPrisma:
            return pzgeom::TPZGeoPrism::TShape(qsiSide,phi,dphi);
        case ECube:
            return pzgeom::TPZGeoCube::TShape(qsiSide,phi,dphi);
        default:{
            std::stringstream sout;
            sout<<"Could not find associated shape function to the side. Details are as follows:"<<std::endl;
            sout<<"Element is of type "<<MElementType_Name(Topology::Type())<<std::endl;
            sout<<"Side\t"<<side<<" is of type\t"<< MElementType_Name(sideType)<<std::endl;
            PZError<<std::endl<<sout.str()<<std::endl;
            DebugStop();
        }
    }
}